

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall
Catch::Matchers::StringEqualsMatcher::match(StringEqualsMatcher *this,string *source)

{
  byte bVar1;
  string *in_RDI;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  string local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  CasedString::adjustString
            ((CasedString *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),in_RDI);
  bVar1 = std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_30);
  return (bool)(bVar1 & 1);
}

Assistant:

bool StringEqualsMatcher::match( std::string const& source ) const {
        return m_comparator.adjustString( source ) == m_comparator.m_str;
    }